

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_>::resizeRefsList
          (BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_> *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  unsigned_long uVar3;
  void *ptr;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char cVar8;
  void *pvVar9;
  long lVar10;
  runtime_error *this_00;
  ulong uVar11;
  size_t size;
  ulong uVar12;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<unsigned_long>_>
  body;
  task_group_context context;
  plus<unsigned_long> local_122;
  auto_partitioner local_121;
  anon_class_8_1_8991fb9c local_120;
  unsigned_long local_118;
  anon_class_16_2_ed117de8_conflict32 local_110;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_std::plus<unsigned_long>_>
  local_100;
  anon_class_24_3_8ee612a4_conflict3 local_e0;
  blocked_range<unsigned_long> local_c8;
  task_group_context local_b0;
  
  uVar3 = *(unsigned_long *)(*(long *)(this + 0x30) + 0x1d8);
  local_118 = 0;
  local_e0.func = &local_120;
  local_b0.my_version = proxy_support;
  local_b0.my_traits = (context_traits)0x4;
  local_b0.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_b0.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_b0.my_name = CUSTOM_CTX;
  local_120.this = (BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *)this;
  local_e0.identity = &local_118;
  local_e0.reduction = &local_122;
  tbb::detail::r1::initialize(&local_b0);
  local_c8.my_begin = 0;
  local_c8.my_grainsize = 1;
  local_100.my_real_body = &local_110;
  local_100.my_value = local_118;
  local_110.reduction = &local_122;
  local_110.func = &local_e0;
  local_100.my_identity_element = &local_118;
  local_100.my_reduction = &local_122;
  local_c8.my_end = uVar3;
  tbb::detail::d1::
  start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_std::plus<unsigned_long>_>,_const_tbb::detail::d1::auto_partitioner>
  ::run(&local_c8,&local_100,&local_121,&local_b0);
  uVar3 = local_100.my_value;
  cVar8 = tbb::detail::r1::is_group_execution_cancelled(&local_b0);
  if (cVar8 == '\0') {
    tbb::detail::r1::destroy(&local_b0);
    if (*(ulong *)(this + 0x48) < uVar3) {
      uVar11 = *(ulong *)(this + 0x50);
      uVar12 = uVar11;
      if ((uVar11 < uVar3) && (uVar12 = uVar3, uVar11 != 0)) {
        while (uVar12 = uVar11, uVar12 < uVar3) {
          uVar11 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
        }
      }
      if (uVar3 < *(ulong *)(this + 0x48)) {
        *(unsigned_long *)(this + 0x48) = uVar3;
      }
      if (*(ulong *)(this + 0x50) == uVar12) {
        *(unsigned_long *)(this + 0x48) = uVar3;
      }
      else {
        ptr = *(void **)(this + 0x58);
        if (uVar12 != 0) {
          (**(code **)**(undefined8 **)(this + 0x38))(*(undefined8 **)(this + 0x38),uVar12 << 6,0);
        }
        size = uVar12 << 6;
        if (size < 0x1c00000) {
          pvVar9 = alignedMalloc(size,0x20);
        }
        else {
          pvVar9 = os_malloc(size,(bool *)(this + 0x40));
        }
        *(void **)(this + 0x58) = pvVar9;
        if (*(long *)(this + 0x48) != 0) {
          lVar10 = 0x20;
          uVar11 = 0;
          do {
            lVar4 = *(long *)(this + 0x58);
            puVar1 = (undefined8 *)((long)ptr + lVar10 + -0x20);
            uVar5 = puVar1[1];
            uVar6 = puVar1[2];
            uVar7 = puVar1[3];
            puVar2 = (undefined8 *)(lVar4 + -0x20 + lVar10);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            puVar2[2] = uVar6;
            puVar2[3] = uVar7;
            *(undefined4 *)(lVar4 + 8 + lVar10) = *(undefined4 *)((long)ptr + lVar10 + 8);
            *(undefined8 *)(lVar4 + lVar10) = *(undefined8 *)((long)ptr + lVar10);
            uVar11 = uVar11 + 1;
            lVar10 = lVar10 + 0x40;
          } while (uVar11 < *(ulong *)(this + 0x48));
        }
        lVar10 = *(long *)(this + 0x50);
        if (ptr != (void *)0x0) {
          if ((ulong)(lVar10 << 6) < 0x1c00000) {
            alignedFree(ptr);
          }
          else {
            os_free(ptr,lVar10 << 6,(bool)this[0x40]);
          }
        }
        if (lVar10 != 0) {
          (**(code **)**(undefined8 **)(this + 0x38))
                    (*(undefined8 **)(this + 0x38),lVar10 * -0x40,1);
        }
        *(unsigned_long *)(this + 0x48) = uVar3;
        *(ulong *)(this + 0x50) = uVar12;
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void resizeRefsList ()
      {
        size_t num = parallel_reduce (size_t(0), scene->size(), size_t(0), 
          [this](const range<size_t>& r)->size_t {
            size_t c = 0;
            for (auto i=r.begin(); i<r.end(); ++i) {
              Mesh* mesh = scene->getSafe<Mesh>(i);
              if (mesh == nullptr || mesh->numTimeSteps != 1)
                continue;
              size_t meshSize = mesh->size();
              c += isSmallGeometry(mesh) ? Primitive::blocks(meshSize) : 1;
            }
            return c;
          },
          std::plus<size_t>()
        );

        if (refs.size() < num) {
          refs.resize(num);
        }
      }